

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.cpp
# Opt level: O3

uint32_t macro_UseNewUniqueID(void)

{
  uniqueID = 0;
  uniqueIDPtr = (char *)0x0;
  return 0;
}

Assistant:

void macro_SetUniqueID(uint32_t id)
{
	uniqueID = id;
	if (id == 0 || id == (uint32_t)-1) {
		uniqueIDPtr = NULL;
	} else {
		// The buffer is guaranteed to be the correct size
		// This is a valid label fragment, but not a valid numeric
		sprintf(uniqueIDBuf, "_u%" PRIu32, id);
		uniqueIDPtr = uniqueIDBuf;
	}
}